

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O3

void Diligent::AppendShaderSourceLanguageDefinition(string *Source,SHADER_SOURCE_LANGUAGE Language)

{
  bool bVar1;
  SHADER_SOURCE_LANGUAGE SVar2;
  char cVar3;
  char cVar4;
  string __str;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  std::__cxx11::string::append((char *)Source);
  std::__cxx11::string::_M_append((char *)Source,ShaderSourceLanguageKey_abi_cxx11_);
  std::__cxx11::string::push_back((char)Source);
  cVar4 = '\x01';
  if ((SHADER_SOURCE_LANGUAGE_COUNT|SHADER_SOURCE_LANGUAGE_HLSL) < Language) {
    SVar2 = Language;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (SVar2 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0034d62e;
      }
      if (SVar2 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0034d62e;
      }
      if (SVar2 < 10000) goto LAB_0034d62e;
      bVar1 = 99999 < SVar2;
      SVar2 = SVar2 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_0034d62e:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40,local_38,Language);
  std::__cxx11::string::_M_append((char *)Source,(ulong)local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  std::__cxx11::string::append((char *)Source);
  return;
}

Assistant:

void AppendShaderSourceLanguageDefinition(std::string& Source, SHADER_SOURCE_LANGUAGE Language)
{
    Source += "/*";
    Source += ShaderSourceLanguageKey;
    Source += '=';
    Source += std::to_string(static_cast<Uint32>(Language));
    Source += "*/";
}